

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

int __thiscall glslang::TType::computeNumComponents(TType *this)

{
  uint uVar1;
  int iVar2;
  TTypeList *pTVar3;
  uint uVar4;
  pointer pTVar5;
  
  if ((this->field_0xb & 8) == 0) {
    iVar2 = (*this->_vptr_TType[7])(this);
    if ((iVar2 == 0xf) || (iVar2 = (*this->_vptr_TType[7])(this), iVar2 == 0x10)) {
      pTVar3 = getStruct(this);
      uVar4 = 0;
      for (pTVar5 = (pTVar3->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_start; pTVar3 = getStruct(this),
          pTVar5 != (pTVar3->
                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                    super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pTVar5 = pTVar5 + 1) {
        iVar2 = computeNumComponents(pTVar5->type);
        uVar4 = uVar4 + iVar2;
      }
    }
    else {
      uVar1 = *(uint *)&this->field_0x8;
      uVar4 = uVar1 >> 0xc & 0xf;
      if (uVar4 == 0) {
        uVar4 = uVar1 >> 8 & 0xf;
      }
      else {
        uVar4 = uVar4 * (uVar1 >> 0x10 & 0xf);
      }
    }
  }
  else {
    uVar4 = TSmallArrayVector::getDimSize(&this->typeParameters->arraySizes->sizes,0);
  }
  if (this->arraySizes != (TArraySizes *)0x0) {
    iVar2 = TArraySizes::getCumulativeSize(this->arraySizes);
    uVar4 = uVar4 * iVar2;
  }
  return uVar4;
}

Assistant:

int computeNumComponents() const
    {
        uint32_t components = 0;

        if (isCoopVecNV()) {
            components = typeParameters->arraySizes->getDimSize(0);
        } else if (getBasicType() == EbtStruct || getBasicType() == EbtBlock) {
            for (TTypeList::const_iterator tl = getStruct()->begin(); tl != getStruct()->end(); tl++)
                components += ((*tl).type)->computeNumComponents();
        } else if (matrixCols)
            components = matrixCols * matrixRows;
        else
            components = vectorSize;

        if (arraySizes != nullptr) {
            components *= arraySizes->getCumulativeSize();
        }

        return static_cast<int>(components);
    }